

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O3

void deqp::gles31::Functional::anon_unknown_0::swizzlePixels
               (PixelBufferAccess *dst,ConstPixelBufferAccess *src,MaybeTextureSwizzle *swizzle)

{
  ChannelType CVar1;
  undefined4 in_EAX;
  int i_2;
  int iVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  undefined1 auVar9 [16];
  ChannelOrder CVar10;
  Vector<int,_4> res;
  undefined1 local_78 [32];
  TextureFormat local_58;
  int aiStack_50 [4];
  ChannelOrder local_40;
  ChannelOrder local_3c;
  ChannelOrder local_38;
  ChannelOrder local_34;
  
  local_78._24_8_ = dst;
  if ((swizzle->m_isSome != true) ||
     (auVar9._0_4_ = -(uint)((swizzle->m_swizzle).m_data[0] == TEXTURESWIZZLECOMPONENT_R),
     auVar9._4_4_ = -(uint)((swizzle->m_swizzle).m_data[1] == TEXTURESWIZZLECOMPONENT_G),
     auVar9._8_4_ = -(uint)((swizzle->m_swizzle).m_data[2] == TEXTURESWIZZLECOMPONENT_B),
     auVar9._12_4_ = -(uint)((swizzle->m_swizzle).m_data[3] == TEXTURESWIZZLECOMPONENT_A),
     iVar2 = movmskps(in_EAX,auVar9), iVar2 == 0xf)) {
    tcu::copy((EVP_PKEY_CTX *)dst,(EVP_PKEY_CTX *)src);
    return;
  }
  CVar1 = (dst->super_ConstPixelBufferAccess).m_format.type;
  uVar3 = (ulong)CVar1;
  iVar2 = (int)src;
  if (uVar3 < 0x22) {
    if ((0x58UL >> (uVar3 & 0x3f) & 1) != 0) {
      iVar4 = (src->m_size).m_data[2];
      if (iVar4 < 1) {
        return;
      }
      iVar5 = (src->m_size).m_data[1];
      iVar7 = 0;
      do {
        if (0 < iVar5) {
          iVar4 = (src->m_size).m_data[0];
          iVar8 = 0;
          do {
            if (0 < iVar4) {
              iVar5 = 0;
              do {
                tcu::ConstPixelBufferAccess::getPixelT<float>
                          ((ConstPixelBufferAccess *)local_78,iVar2,iVar5,iVar8);
                local_58.order = R;
                local_58.type = SNORM_INT8;
                aiStack_50[0] = 0;
                aiStack_50[1] = 0;
                lVar6 = 0;
                do {
                  switch((swizzle->m_swizzle).m_data[lVar6]) {
                  case TEXTURESWIZZLECOMPONENT_R:
                    CVar10 = local_78._0_4_;
                    break;
                  case TEXTURESWIZZLECOMPONENT_G:
                    CVar10 = local_78._4_4_;
                    break;
                  case TEXTURESWIZZLECOMPONENT_B:
                    CVar10 = local_78._8_4_;
                    break;
                  case TEXTURESWIZZLECOMPONENT_A:
                    CVar10 = local_78._12_4_;
                    break;
                  case TEXTURESWIZZLECOMPONENT_ZERO:
                    CVar10 = R;
                    break;
                  case TEXTURESWIZZLECOMPONENT_ONE:
                    CVar10 = 0x3f800000;
                    break;
                  default:
                    CVar10 = 0xbf800000;
                  }
                  (&local_58.order)[lVar6] = CVar10;
                  lVar6 = lVar6 + 1;
                } while (lVar6 != 4);
                tcu::PixelBufferAccess::setPixel
                          ((PixelBufferAccess *)local_78._24_8_,(Vec4 *)&local_58,iVar5,iVar8,iVar7)
                ;
                iVar5 = iVar5 + 1;
                iVar4 = (src->m_size).m_data[0];
              } while (iVar5 < iVar4);
              iVar5 = (src->m_size).m_data[1];
            }
            iVar8 = iVar8 + 1;
          } while (iVar8 < iVar5);
          iVar4 = (src->m_size).m_data[2];
        }
        iVar7 = iVar7 + 1;
      } while (iVar7 < iVar4);
      return;
    }
    if ((0x2c0000000U >> (uVar3 & 0x3f) & 1) != 0) {
      iVar4 = (src->m_size).m_data[2];
      if (iVar4 < 1) {
        return;
      }
      iVar5 = (src->m_size).m_data[1];
      iVar7 = 0;
      do {
        if (0 < iVar5) {
          iVar4 = (src->m_size).m_data[0];
          iVar8 = 0;
          do {
            if (0 < iVar4) {
              iVar5 = 0;
              do {
                tcu::ConstPixelBufferAccess::getPixelT<unsigned_int>
                          ((ConstPixelBufferAccess *)&local_40,iVar2,iVar5,iVar8);
                local_78._0_4_ = R;
                local_78._4_4_ = SNORM_INT8;
                local_78._8_4_ = 0;
                local_78._12_4_ = 0;
                lVar6 = 0;
                do {
                  switch((swizzle->m_swizzle).m_data[lVar6]) {
                  case TEXTURESWIZZLECOMPONENT_R:
                    CVar10 = local_40;
                    break;
                  case TEXTURESWIZZLECOMPONENT_G:
                    CVar10 = local_3c;
                    break;
                  case TEXTURESWIZZLECOMPONENT_B:
                    CVar10 = local_38;
                    break;
                  case TEXTURESWIZZLECOMPONENT_A:
                    CVar10 = local_34;
                    break;
                  case TEXTURESWIZZLECOMPONENT_ZERO:
                    CVar10 = R;
                    break;
                  case TEXTURESWIZZLECOMPONENT_ONE:
                    CVar10 = A;
                    break;
                  default:
                    CVar10 = ~R;
                  }
                  *(ChannelOrder *)(local_78 + lVar6 * 4) = CVar10;
                  lVar6 = lVar6 + 1;
                } while (lVar6 != 4);
                local_58.order = local_78._0_4_;
                local_58.type = local_78._4_4_;
                aiStack_50[0] = local_78._8_4_;
                aiStack_50[1] = local_78._12_4_;
                tcu::PixelBufferAccess::setPixel
                          ((PixelBufferAccess *)local_78._24_8_,(IVec4 *)&local_58,iVar5,iVar8,iVar7
                          );
                iVar5 = iVar5 + 1;
                iVar4 = (src->m_size).m_data[0];
              } while (iVar5 < iVar4);
              iVar5 = (src->m_size).m_data[1];
            }
            iVar8 = iVar8 + 1;
          } while (iVar8 < iVar5);
          iVar4 = (src->m_size).m_data[2];
        }
        iVar7 = iVar7 + 1;
      } while (iVar7 < iVar4);
      return;
    }
  }
  if ((CVar1 - SIGNED_INT8 < 3) && (iVar4 = (src->m_size).m_data[2], 0 < iVar4)) {
    iVar5 = (src->m_size).m_data[1];
    iVar7 = 0;
    do {
      if (0 < iVar5) {
        iVar4 = (src->m_size).m_data[0];
        iVar8 = 0;
        do {
          if (0 < iVar4) {
            iVar5 = 0;
            do {
              tcu::ConstPixelBufferAccess::getPixelT<int>
                        ((ConstPixelBufferAccess *)local_78,iVar2,iVar5,iVar8);
              local_58.order = R;
              local_58.type = SNORM_INT8;
              aiStack_50[0] = 0;
              aiStack_50[1] = 0;
              lVar6 = 0;
              do {
                switch((swizzle->m_swizzle).m_data[lVar6]) {
                case TEXTURESWIZZLECOMPONENT_R:
                  CVar10 = local_78._0_4_;
                  break;
                case TEXTURESWIZZLECOMPONENT_G:
                  CVar10 = local_78._4_4_;
                  break;
                case TEXTURESWIZZLECOMPONENT_B:
                  CVar10 = local_78._8_4_;
                  break;
                case TEXTURESWIZZLECOMPONENT_A:
                  CVar10 = local_78._12_4_;
                  break;
                case TEXTURESWIZZLECOMPONENT_ZERO:
                  CVar10 = R;
                  break;
                case TEXTURESWIZZLECOMPONENT_ONE:
                  CVar10 = A;
                  break;
                default:
                  CVar10 = ~R;
                }
                (&local_58.order)[lVar6] = CVar10;
                lVar6 = lVar6 + 1;
              } while (lVar6 != 4);
              tcu::PixelBufferAccess::setPixel
                        ((PixelBufferAccess *)local_78._24_8_,(IVec4 *)&local_58,iVar5,iVar8,iVar7);
              iVar5 = iVar5 + 1;
              iVar4 = (src->m_size).m_data[0];
            } while (iVar5 < iVar4);
            iVar5 = (src->m_size).m_data[1];
          }
          iVar8 = iVar8 + 1;
        } while (iVar8 < iVar5);
        iVar4 = (src->m_size).m_data[2];
      }
      iVar7 = iVar7 + 1;
    } while (iVar7 < iVar4);
  }
  return;
}

Assistant:

static void swizzlePixels (const PixelBufferAccess& dst, const ConstPixelBufferAccess& src, const MaybeTextureSwizzle& swizzle)
{
	if (isDepthFormat(dst.getFormat()))
		DE_ASSERT(swizzle.isNone() || swizzle.isIdentitySwizzle());

	if (swizzle.isNone() || swizzle.isIdentitySwizzle())
		tcu::copy(dst, src);
	else if (isUnormFormatType(dst.getFormat().type))
		swizzlePixels<float>(dst, src, swizzle);
	else if (isUIntFormatType(dst.getFormat().type))
		swizzlePixels<deUint32>(dst, src, swizzle);
	else if (isSIntFormatType(dst.getFormat().type))
		swizzlePixels<deInt32>(dst, src, swizzle);
	else
		DE_ASSERT(false);
}